

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O3

uint crnlib::symbol_codec::encode_truncated_binary_cost(uint v,uint n)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = 0;
  if (1 < n) {
    uVar3 = 0;
    uVar2 = n;
    do {
      uVar3 = uVar3 + 1;
      bVar1 = 3 < uVar2;
      uVar2 = uVar2 >> 1;
    } while (bVar1);
  }
  uVar2 = uVar3 + 1;
  if (v < (1 << ((byte)(uVar3 + 1) & 0x1f)) - n) {
    uVar2 = uVar3;
  }
  return uVar2;
}

Assistant:

uint symbol_codec::encode_truncated_binary_cost(uint v, uint n)
    {
        CRNLIB_ASSERT((n >= 2) && (v < n));

        uint k = math::floor_log2i(n);
        uint u = (1 << (k + 1)) - n;

        if (v < u)
        {
            return k;
        }
        else
        {
            return k + 1;
        }
    }